

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unicodeAddExceptions(unicode_tokenizer *p,int bAlnum,char *zIn,int nIn)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  
  if (nIn != 0) {
    pbVar9 = (byte *)(zIn + (uint)nIn);
    iVar10 = 0;
    pbVar13 = (byte *)zIn;
    do {
      bVar1 = *pbVar13;
      uVar11 = (uint)bVar1;
      pbVar13 = pbVar13 + 1;
      if (0xbf < bVar1) {
        uVar2 = (uint)""[bVar1 - 0xc0];
        for (; (pbVar13 < pbVar9 && ((*pbVar13 & 0xffffffc0) == 0x80)); pbVar13 = pbVar13 + 1) {
          uVar2 = uVar2 << 6 | *pbVar13 & 0x3f;
        }
        uVar11 = uVar2;
        if ((uVar2 & 0xfffff800) == 0xd800) {
          uVar11 = 0xfffd;
        }
        if (uVar2 < 0x80) {
          uVar11 = 0xfffd;
        }
        if ((uVar2 & 0xfffffffe) == 0xfffe) {
          uVar11 = 0xfffd;
        }
      }
      iVar3 = sqlite3FtsUnicodeIsalnum(uVar11);
      if (iVar3 != bAlnum) {
        if (uVar11 - 0x332 < 0xffffffce) {
          iVar10 = iVar10 + 1;
        }
        else {
          uVar2 = 0x361f8;
          if (uVar11 < 800) {
            uVar2 = 0x8029fdf;
          }
          iVar10 = iVar10 + (uint)((1 << ((byte)uVar11 & 0x1f) & uVar2) == 0);
        }
      }
    } while (pbVar13 < pbVar9);
    if (iVar10 == 0) {
      return 0;
    }
    piVar5 = p->aiException;
    iVar3 = p->nException;
    iVar4 = sqlite3_initialize();
    if (iVar4 != 0) {
      return 7;
    }
    piVar5 = (int *)sqlite3Realloc(piVar5,((long)iVar3 + (long)iVar10) * 4);
    if (piVar5 == (int *)0x0) {
      return 7;
    }
    uVar11 = p->nException;
    uVar12 = (ulong)uVar11;
    if (nIn != 0) {
      do {
        bVar1 = *zIn;
        uVar11 = (uint)bVar1;
        zIn = (char *)((byte *)zIn + 1);
        if (0xbf < bVar1) {
          uVar2 = (uint)""[bVar1 - 0xc0];
          for (; (zIn < pbVar9 && (((byte)*zIn & 0xffffffc0) == 0x80));
              zIn = (char *)((byte *)zIn + 1)) {
            uVar2 = uVar2 << 6 | (byte)*zIn & 0x3f;
          }
          uVar11 = uVar2;
          if ((uVar2 & 0xfffff800) == 0xd800) {
            uVar11 = 0xfffd;
          }
          if (uVar2 < 0x80) {
            uVar11 = 0xfffd;
          }
          if ((uVar2 & 0xfffffffe) == 0xfffe) {
            uVar11 = 0xfffd;
          }
        }
        iVar10 = sqlite3FtsUnicodeIsalnum(uVar11);
        if (iVar10 != bAlnum) {
          if (0xffffffcd < uVar11 - 0x332) {
            uVar2 = 0x361f8;
            if (uVar11 < 800) {
              uVar2 = 0x8029fdf;
            }
            if ((uVar2 >> (uVar11 - 0x20 & 0x1f) & 1) != 0) goto LAB_001c0785;
          }
          iVar10 = (int)uVar12;
          if (iVar10 < 1) {
            uVar7 = 0;
          }
          else {
            uVar6 = 0;
            do {
              uVar7 = uVar6;
              if ((int)uVar11 <= piVar5[uVar6]) break;
              uVar6 = uVar6 + 1;
              uVar7 = uVar12;
            } while (uVar12 != uVar6);
          }
          if ((int)uVar7 < iVar10) {
            lVar8 = (long)iVar10;
            do {
              piVar5[lVar8] = piVar5[lVar8 + -1];
              lVar8 = lVar8 + -1;
            } while ((int)uVar7 < lVar8);
          }
          piVar5[uVar7 & 0xffffffff] = uVar11;
          uVar12 = (ulong)(iVar10 + 1);
        }
LAB_001c0785:
        uVar11 = (uint)uVar12;
      } while (zIn < pbVar9);
    }
    p->aiException = piVar5;
    p->nException = uVar11;
  }
  return 0;
}

Assistant:

static int unicodeAddExceptions(
  unicode_tokenizer *p,           /* Tokenizer to add exceptions to */
  int bAlnum,                     /* Replace Isalnum() return value with this */
  const char *zIn,                /* Array of characters to make exceptions */
  int nIn                         /* Length of z in bytes */
){
  const unsigned char *z = (const unsigned char *)zIn;
  const unsigned char *zTerm = &z[nIn];
  unsigned int iCode;
  int nEntry = 0;

  assert( bAlnum==0 || bAlnum==1 );

  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    assert( (sqlite3FtsUnicodeIsalnum((int)iCode) & 0xFFFFFFFE)==0 );
    if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum
     && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
    ){
      nEntry++;
    }
  }

  if( nEntry ){
    int *aNew;                    /* New aiException[] array */
    int nNew;                     /* Number of valid entries in array aNew[] */

    aNew = sqlite3_realloc64(p->aiException,(p->nException+nEntry)*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    nNew = p->nException;

    z = (const unsigned char *)zIn;
    while( z<zTerm ){
      READ_UTF8(z, zTerm, iCode);
      if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum
       && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
      ){
        int i, j;
        for(i=0; i<nNew && aNew[i]<(int)iCode; i++);
        for(j=nNew; j>i; j--) aNew[j] = aNew[j-1];
        aNew[i] = (int)iCode;
        nNew++;
      }
    }
    p->aiException = aNew;
    p->nException = nNew;
  }

  return SQLITE_OK;
}